

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_cwd(char *buffer,size_t size)

{
  char *pcVar1;
  int *piVar2;
  size_t in_RSI;
  char *in_RDI;
  undefined4 local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = -0x16;
  }
  else if (in_RSI == 0) {
    local_4 = -0x16;
  }
  else {
    pcVar1 = getcwd(in_RDI,in_RSI);
    if (pcVar1 == (char *)0x0) {
      piVar2 = __errno_location();
      local_4 = -*piVar2;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int uv_cwd(char* buffer, size_t size) {
  if (buffer == NULL)
    return -EINVAL;

  if (size == 0)
    return -EINVAL;

  if (getcwd(buffer, size) == NULL)
    return -errno;

  return 0;
}